

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_connect_nonblocking
                   (Curl_easy *data,connectdata *conn,_Bool isproxy,int sockindex,_Bool *done)

{
  _Bool _Var1;
  CURLcode result;
  _Bool *done_local;
  int sockindex_local;
  _Bool isproxy_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((((conn->bits).proxy_ssl_connected[sockindex] & 1U) == 0) ||
     (data_local._4_4_ = ssl_connect_init_proxy(conn,sockindex), data_local._4_4_ == CURLE_OK)) {
    _Var1 = ssl_prefs_check(data);
    if (_Var1) {
      conn->ssl[sockindex].field_0x10 = conn->ssl[sockindex].field_0x10 & 0xfe | 1;
      data_local._4_4_ = (*Curl_ssl->connect_nonblocking)(data,conn,sockindex,done);
      if (data_local._4_4_ == CURLE_OK) {
        if (((*done & 1U) != 0) && (!isproxy)) {
          Curl_pgrsTime(data,TIMER_APPCONNECT);
        }
      }
      else {
        conn->ssl[sockindex].field_0x10 = conn->ssl[sockindex].field_0x10 & 0xfe;
      }
    }
    else {
      data_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode
Curl_ssl_connect_nonblocking(struct Curl_easy *data, struct connectdata *conn,
                             bool isproxy, int sockindex, bool *done)
{
  CURLcode result;

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy_ssl_connected[sockindex]) {
    result = ssl_connect_init_proxy(conn, sockindex);
    if(result)
      return result;
  }
#endif
  if(!ssl_prefs_check(data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl requested from here on. */
  conn->ssl[sockindex].use = TRUE;
  result = Curl_ssl->connect_nonblocking(data, conn, sockindex, done);
  if(result)
    conn->ssl[sockindex].use = FALSE;
  else if(*done && !isproxy)
    Curl_pgrsTime(data, TIMER_APPCONNECT); /* SSL is connected */
  return result;
}